

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_common.c
# Opt level: O0

uint8_t lys_stmt_flags(ly_stmt stmt)

{
  ly_stmt stmt_local;
  
  if (stmt != LY_STMT_NONE) {
    if (stmt == LY_STMT_NOTIFICATION) {
      return '\x02';
    }
    if ((stmt != LY_STMT_INPUT) && (stmt != LY_STMT_OUTPUT)) {
      if (stmt == LY_STMT_ACTION) {
        return '\x02';
      }
      if (stmt == LY_STMT_RPC) {
        return '\x02';
      }
      if (stmt == LY_STMT_ANYDATA) {
        return '\x02';
      }
      if (stmt == LY_STMT_ANYXML) {
        return '\x02';
      }
      if (stmt == LY_STMT_AUGMENT) {
        return '\x02';
      }
      if (stmt == LY_STMT_CASE) {
        return '\x02';
      }
      if (stmt == LY_STMT_CHOICE) {
        return '\x02';
      }
      if (stmt == LY_STMT_CONTAINER) {
        return '\x02';
      }
      if (stmt == LY_STMT_GROUPING) {
        return '\x02';
      }
      if (stmt == LY_STMT_LEAF) {
        return '\x02';
      }
      if (stmt == LY_STMT_LEAF_LIST) {
        return '\x02';
      }
      if (stmt == LY_STMT_LIST) {
        return '\x02';
      }
      if (stmt == LY_STMT_USES) {
        return '\x02';
      }
      if (stmt == LY_STMT_ARGUMENT) {
        return '\x02';
      }
      if (stmt == LY_STMT_BASE) {
        return '\x02';
      }
      if (stmt == LY_STMT_BELONGS_TO) {
        return '\x02';
      }
      if (stmt == LY_STMT_BIT) {
        return '\x02';
      }
      if (stmt == LY_STMT_CONFIG) {
        return '\x02';
      }
      if (stmt == LY_STMT_CONTACT) {
        return '\x01';
      }
      if (stmt != LY_STMT_DEFAULT) {
        if (stmt == LY_STMT_DESCRIPTION) {
          return '\x01';
        }
        if (stmt == LY_STMT_DEVIATE) {
          return '\x02';
        }
        if (stmt == LY_STMT_DEVIATION) {
          return '\x02';
        }
        if (stmt == LY_STMT_ENUM) {
          return '\x02';
        }
        if (stmt != LY_STMT_ERROR_APP_TAG) {
          if (stmt == LY_STMT_ERROR_MESSAGE) {
            return '\x01';
          }
          if (stmt == LY_STMT_EXTENSION) {
            return '\x02';
          }
          if (stmt != LY_STMT_EXTENSION_INSTANCE) {
            if (stmt == LY_STMT_FEATURE) {
              return '\x02';
            }
            if (stmt == LY_STMT_FRACTION_DIGITS) {
              return '\x02';
            }
            if (stmt == LY_STMT_IDENTITY) {
              return '\x02';
            }
            if (stmt != LY_STMT_IF_FEATURE) {
              if (stmt == LY_STMT_IMPORT) {
                return '\x02';
              }
              if (stmt == LY_STMT_INCLUDE) {
                return '\x02';
              }
              if ((stmt != LY_STMT_KEY) && (stmt != LY_STMT_LENGTH)) {
                if (stmt == LY_STMT_MANDATORY) {
                  return '\x02';
                }
                if (stmt == LY_STMT_MAX_ELEMENTS) {
                  return '\x02';
                }
                if (stmt == LY_STMT_MIN_ELEMENTS) {
                  return '\x02';
                }
                if (stmt == LY_STMT_MODIFIER) {
                  return '\x02';
                }
                if (stmt == LY_STMT_MODULE) {
                  return '\x02';
                }
                if ((stmt != LY_STMT_MUST) && (stmt != LY_STMT_NAMESPACE)) {
                  if (stmt == LY_STMT_ORDERED_BY) {
                    return '\x02';
                  }
                  if (stmt == LY_STMT_ORGANIZATION) {
                    return '\x01';
                  }
                  if ((stmt != LY_STMT_PATH) && (stmt != LY_STMT_PATTERN)) {
                    if (stmt == LY_STMT_POSITION) {
                      return '\x02';
                    }
                    if (stmt == LY_STMT_PREFIX) {
                      return '\x02';
                    }
                    if ((stmt != LY_STMT_PRESENCE) && (stmt != LY_STMT_RANGE)) {
                      if (stmt == LY_STMT_REFERENCE) {
                        return '\x01';
                      }
                      if (stmt == LY_STMT_REFINE) {
                        return '\x02';
                      }
                      if (stmt == LY_STMT_REQUIRE_INSTANCE) {
                        return '\x02';
                      }
                      if (stmt == LY_STMT_REVISION) {
                        return '\x02';
                      }
                      if (stmt == LY_STMT_REVISION_DATE) {
                        return '\x02';
                      }
                      if (stmt == LY_STMT_STATUS) {
                        return '\x02';
                      }
                      if (stmt == LY_STMT_SUBMODULE) {
                        return '\x02';
                      }
                      if (stmt == LY_STMT_TYPE) {
                        return '\x02';
                      }
                      if (stmt == LY_STMT_TYPEDEF) {
                        return '\x02';
                      }
                      if ((stmt != LY_STMT_UNIQUE) && (stmt != LY_STMT_UNITS)) {
                        if (stmt == LY_STMT_VALUE) {
                          return '\x02';
                        }
                        if (stmt != LY_STMT_WHEN) {
                          if (stmt == LY_STMT_YANG_VERSION) {
                            return '\x02';
                          }
                          if (stmt == LY_STMT_YIN_ELEMENT) {
                            return '\x02';
                          }
                          if (4 < stmt - LY_STMT_SYNTAX_SEMICOLON) {
                            return '\0';
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return '\0';
}

Assistant:

uint8_t
lys_stmt_flags(enum ly_stmt stmt)
{
    switch (stmt) {
    case LY_STMT_NONE:
    case LY_STMT_ARG_TEXT:
    case LY_STMT_ARG_VALUE:
    case LY_STMT_DEFAULT:
    case LY_STMT_ERROR_APP_TAG:
    case LY_STMT_EXTENSION_INSTANCE:
    case LY_STMT_IF_FEATURE:
    case LY_STMT_INPUT:
    case LY_STMT_KEY:
    case LY_STMT_LENGTH:
    case LY_STMT_MUST:
    case LY_STMT_NAMESPACE:
    case LY_STMT_OUTPUT:
    case LY_STMT_PATH:
    case LY_STMT_PATTERN:
    case LY_STMT_PRESENCE:
    case LY_STMT_RANGE:
    case LY_STMT_SYNTAX_LEFT_BRACE:
    case LY_STMT_SYNTAX_RIGHT_BRACE:
    case LY_STMT_SYNTAX_SEMICOLON:
    case LY_STMT_UNIQUE:
    case LY_STMT_UNITS:
    case LY_STMT_WHEN:
        return 0;
    case LY_STMT_ACTION:
    case LY_STMT_ANYDATA:
    case LY_STMT_ANYXML:
    case LY_STMT_ARGUMENT:
    case LY_STMT_AUGMENT:
    case LY_STMT_BASE:
    case LY_STMT_BELONGS_TO:
    case LY_STMT_BIT:
    case LY_STMT_CASE:
    case LY_STMT_CHOICE:
    case LY_STMT_CONFIG:
    case LY_STMT_CONTAINER:
    case LY_STMT_DEVIATE:
    case LY_STMT_DEVIATION:
    case LY_STMT_ENUM:
    case LY_STMT_EXTENSION:
    case LY_STMT_FEATURE:
    case LY_STMT_FRACTION_DIGITS:
    case LY_STMT_GROUPING:
    case LY_STMT_IDENTITY:
    case LY_STMT_IMPORT:
    case LY_STMT_INCLUDE:
    case LY_STMT_LEAF:
    case LY_STMT_LEAF_LIST:
    case LY_STMT_LIST:
    case LY_STMT_MANDATORY:
    case LY_STMT_MAX_ELEMENTS:
    case LY_STMT_MIN_ELEMENTS:
    case LY_STMT_MODIFIER:
    case LY_STMT_MODULE:
    case LY_STMT_NOTIFICATION:
    case LY_STMT_ORDERED_BY:
    case LY_STMT_POSITION:
    case LY_STMT_PREFIX:
    case LY_STMT_REFINE:
    case LY_STMT_REQUIRE_INSTANCE:
    case LY_STMT_REVISION:
    case LY_STMT_REVISION_DATE:
    case LY_STMT_RPC:
    case LY_STMT_STATUS:
    case LY_STMT_SUBMODULE:
    case LY_STMT_TYPE:
    case LY_STMT_TYPEDEF:
    case LY_STMT_USES:
    case LY_STMT_VALUE:
    case LY_STMT_YANG_VERSION:
    case LY_STMT_YIN_ELEMENT:
        return LY_STMT_FLAG_ID;
    case LY_STMT_CONTACT:
    case LY_STMT_DESCRIPTION:
    case LY_STMT_ERROR_MESSAGE:
    case LY_STMT_ORGANIZATION:
    case LY_STMT_REFERENCE:
        return LY_STMT_FLAG_YIN;
    }

    return 0;
}